

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsortfilterproxymodel.cpp
# Opt level: O0

bool __thiscall
QSortFilterProxyModel::filterAcceptsRow
          (QSortFilterProxyModel *this,int source_row,QModelIndex *source_parent)

{
  QAbstractItemModel *pQVar1;
  bool bVar2;
  int iVar3;
  parameter_type pVar4;
  uint uVar5;
  arrow_operator_result ppQVar6;
  QRegularExpressionMatch *rmatch;
  undefined8 in_RDX;
  uint in_ESI;
  long in_FS_OFFSET;
  int column;
  int column_count;
  QSortFilterProxyModelPrivate *d;
  QString key;
  QModelIndex source_index;
  QString key_1;
  QModelIndex source_index_1;
  QVariant *in_stack_fffffffffffffe68;
  undefined6 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe76;
  undefined1 in_stack_fffffffffffffe77;
  QRegularExpressionMatch *in_stack_fffffffffffffe78;
  QRegularExpression *in_stack_fffffffffffffe80;
  QAbstractItemModel *pQVar7;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  uint local_108;
  byte local_d9;
  undefined1 *local_b8;
  undefined1 *puStack_b0;
  undefined1 *local_a8;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 local_48 [32];
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QSortFilterProxyModel *)0x87a5e0);
  QObjectCompatProperty<QSortFilterProxyModelPrivate,_QRegularExpression,_&QSortFilterProxyModelPrivate::_qt_property_filter_regularexpression_offset,_&QSortFilterProxyModelPrivate::setFilterRegularExpressionForwarder,_nullptr,_nullptr>
  ::value((QObjectCompatProperty<QSortFilterProxyModelPrivate,_QRegularExpression,_&QSortFilterProxyModelPrivate::_qt_property_filter_regularexpression_offset,_&QSortFilterProxyModelPrivate::setFilterRegularExpressionForwarder,_nullptr,_nullptr>
           *)CONCAT17(in_stack_fffffffffffffe77,
                      CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)));
  QRegularExpression::pattern((QRegularExpression *)in_stack_fffffffffffffe78);
  bVar2 = QString::isEmpty((QString *)0x87a619);
  QString::~QString((QString *)0x87a62a);
  if (bVar2) {
    local_d9 = 1;
  }
  else {
    ppQVar6 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
              ::operator->((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                            *)CONCAT17(in_stack_fffffffffffffe77,
                                       CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)
                                      ));
    iVar3 = (*((*ppQVar6)->super_QObject)._vptr_QObject[0x10])(*ppQVar6,in_RDX);
    pVar4 = ::QObjectCompatProperty::operator_cast_to_int
                      ((QObjectCompatProperty<QSortFilterProxyModelPrivate,_int,_&QSortFilterProxyModelPrivate::_qt_property_filter_column_offset,_&QSortFilterProxyModelPrivate::setFilterKeyColumnForwarder,_nullptr,_nullptr>
                        *)0x87a684);
    if (pVar4 == -1) {
      for (local_108 = 0; (int)local_108 < iVar3; local_108 = local_108 + 1) {
        local_78 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
        local_68 = &DAT_aaaaaaaaaaaaaaaa;
        ppQVar6 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                  ::operator->((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                                *)CONCAT17(in_stack_fffffffffffffe77,
                                           CONCAT16(in_stack_fffffffffffffe76,
                                                    in_stack_fffffffffffffe70)));
        (*((*ppQVar6)->super_QObject)._vptr_QObject[0xc])
                  (&local_78,*ppQVar6,(ulong)in_ESI,(ulong)local_108,in_RDX);
        local_88 = &DAT_aaaaaaaaaaaaaaaa;
        local_98 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
        ppQVar6 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                  ::operator->((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                                *)CONCAT17(in_stack_fffffffffffffe77,
                                           CONCAT16(in_stack_fffffffffffffe76,
                                                    in_stack_fffffffffffffe70)));
        pQVar7 = *ppQVar6;
        uVar5 = ::QObjectCompatProperty::operator_cast_to_int
                          ((QObjectCompatProperty<QSortFilterProxyModelPrivate,_int,_&QSortFilterProxyModelPrivate::_qt_property_filter_role_offset,_&QSortFilterProxyModelPrivate::setFilterRoleForwarder,_&QSortFilterProxyModelPrivate::filterRoleChangedForwarder,_nullptr>
                            *)0x87a761);
        (*(pQVar7->super_QObject)._vptr_QObject[0x12])(local_28,pQVar7,&local_78,(ulong)uVar5);
        ::QVariant::toString(in_stack_fffffffffffffe68);
        ::QVariant::~QVariant
                  ((QVariant *)
                   CONCAT17(in_stack_fffffffffffffe77,
                            CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)));
        QObjectCompatProperty<QSortFilterProxyModelPrivate,_QRegularExpression,_&QSortFilterProxyModelPrivate::_qt_property_filter_regularexpression_offset,_&QSortFilterProxyModelPrivate::setFilterRegularExpressionForwarder,_nullptr,_nullptr>
        ::value((QObjectCompatProperty<QSortFilterProxyModelPrivate,_QRegularExpression,_&QSortFilterProxyModelPrivate::_qt_property_filter_regularexpression_offset,_&QSortFilterProxyModelPrivate::setFilterRegularExpressionForwarder,_nullptr,_nullptr>
                 *)CONCAT17(in_stack_fffffffffffffe77,
                            CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)));
        bVar2 = QString::contains((QString *)
                                  CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                                  in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
        if (bVar2) {
          local_d9 = 1;
        }
        QString::~QString((QString *)0x87a869);
        if (bVar2) goto LAB_0087aa92;
      }
      local_d9 = 0;
    }
    else {
      pVar4 = ::QObjectCompatProperty::operator_cast_to_int
                        ((QObjectCompatProperty<QSortFilterProxyModelPrivate,_int,_&QSortFilterProxyModelPrivate::_qt_property_filter_column_offset,_&QSortFilterProxyModelPrivate::setFilterKeyColumnForwarder,_nullptr,_nullptr>
                          *)0x87a8b4);
      if (pVar4 < iVar3) {
        local_b8 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
        local_a8 = &DAT_aaaaaaaaaaaaaaaa;
        ppQVar6 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                  ::operator->((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                                *)CONCAT17(in_stack_fffffffffffffe77,
                                           CONCAT16(in_stack_fffffffffffffe76,
                                                    in_stack_fffffffffffffe70)));
        pQVar7 = *ppQVar6;
        uVar5 = ::QObjectCompatProperty::operator_cast_to_int
                          ((QObjectCompatProperty<QSortFilterProxyModelPrivate,_int,_&QSortFilterProxyModelPrivate::_qt_property_filter_column_offset,_&QSortFilterProxyModelPrivate::setFilterKeyColumnForwarder,_nullptr,_nullptr>
                            *)0x87a92b);
        (*(pQVar7->super_QObject)._vptr_QObject[0xc])
                  (&local_b8,pQVar7,(ulong)in_ESI,(ulong)uVar5,in_RDX);
        ppQVar6 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                  ::operator->((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                                *)CONCAT17(in_stack_fffffffffffffe77,
                                           CONCAT16(in_stack_fffffffffffffe76,
                                                    in_stack_fffffffffffffe70)));
        pQVar1 = *ppQVar6;
        uVar5 = ::QObjectCompatProperty::operator_cast_to_int
                          ((QObjectCompatProperty<QSortFilterProxyModelPrivate,_int,_&QSortFilterProxyModelPrivate::_qt_property_filter_role_offset,_&QSortFilterProxyModelPrivate::setFilterRoleForwarder,_&QSortFilterProxyModelPrivate::filterRoleChangedForwarder,_nullptr>
                            *)0x87a9a0);
        (*(pQVar1->super_QObject)._vptr_QObject[0x12])(local_48,pQVar1,&local_b8,(ulong)uVar5);
        ::QVariant::toString(in_stack_fffffffffffffe68);
        ::QVariant::~QVariant
                  ((QVariant *)
                   CONCAT17(in_stack_fffffffffffffe77,
                            CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)));
        rmatch = (QRegularExpressionMatch *)
                 QObjectCompatProperty<QSortFilterProxyModelPrivate,_QRegularExpression,_&QSortFilterProxyModelPrivate::_qt_property_filter_regularexpression_offset,_&QSortFilterProxyModelPrivate::setFilterRegularExpressionForwarder,_nullptr,_nullptr>
                 ::value((QObjectCompatProperty<QSortFilterProxyModelPrivate,_QRegularExpression,_&QSortFilterProxyModelPrivate::_qt_property_filter_regularexpression_offset,_&QSortFilterProxyModelPrivate::setFilterRegularExpressionForwarder,_nullptr,_nullptr>
                          *)CONCAT17(in_stack_fffffffffffffe77,
                                     CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)))
        ;
        local_d9 = QString::contains((QString *)CONCAT44(in_ESI,in_stack_fffffffffffffe88),
                                     (QRegularExpression *)pQVar7,rmatch);
        QString::~QString((QString *)0x87aa42);
      }
      else {
        local_d9 = 1;
      }
    }
  }
LAB_0087aa92:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_d9 & 1);
}

Assistant:

bool QSortFilterProxyModel::filterAcceptsRow(int source_row, const QModelIndex &source_parent) const
{
    Q_D(const QSortFilterProxyModel);

    if (d->filter_regularexpression.value().pattern().isEmpty())
        return true;

    int column_count = d->model->columnCount(source_parent);
    if (d->filter_column == -1) {
        for (int column = 0; column < column_count; ++column) {
            QModelIndex source_index = d->model->index(source_row, column, source_parent);
            QString key = d->model->data(source_index, d->filter_role).toString();
            if (key.contains(d->filter_regularexpression.value()))
                return true;
        }
        return false;
    }

    if (d->filter_column >= column_count) // the column may not exist
        return true;
    QModelIndex source_index = d->model->index(source_row, d->filter_column, source_parent);
    QString key = d->model->data(source_index, d->filter_role).toString();
    return key.contains(d->filter_regularexpression.value());
}